

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# advconsole.unix.cpp
# Opt level: O0

void AdvancedConsole::Cursor::getSize(int *rows,int *cols)

{
  Cursor local_48;
  int local_3c;
  int local_38;
  int iTempCol;
  int iTempRow;
  int local_28;
  int local_24;
  int iTempLastCol;
  int iTempLastRow;
  int iOldCol;
  int iOldRow;
  int *cols_local;
  int *rows_local;
  
  _iOldCol = cols;
  cols_local = rows;
  getPosition(&iTempLastRow,&iTempLastCol);
  local_24 = iTempLastRow;
  local_28 = iTempLastCol;
  while( true ) {
    Cursor((Cursor *)&iTempCol,100,100,AC_RELATIVE);
    AdvancedConsole::operator<<((ostream *)&std::cout,(Cursor *)&iTempCol);
    getPosition(&local_38,&local_3c);
    if ((local_38 == local_24) && (local_3c == local_28)) break;
    local_24 = local_38;
    local_28 = local_3c;
  }
  Cursor(&local_48,iTempLastRow,iTempLastCol,AC_ABSOLUTE);
  AdvancedConsole::operator<<((ostream *)&std::cout,&local_48);
  *cols_local = local_24;
  *_iOldCol = local_28;
  return;
}

Assistant:

void AdvancedConsole::Cursor::getSize(int& rows, int& cols)
{
	int iOldRow, iOldCol;
	getPosition(iOldRow, iOldCol);
	
	int iTempLastRow = iOldRow, iTempLastCol = iOldCol;
	while (true)
	{
		cout << Cursor(100, 100, AC_RELATIVE);
		int iTempRow, iTempCol;
		getPosition(iTempRow, iTempCol);
		
		if (iTempRow != iTempLastRow || iTempCol != iTempLastCol)
		{
			iTempLastRow = iTempRow;
			iTempLastCol = iTempCol;
		}
		else
			break;
	}
	
	cout << Cursor(iOldRow, iOldCol, AC_ABSOLUTE);
	rows = iTempLastRow;
	cols = iTempLastCol;
}